

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-bind.c
# Opt level: O2

int run_test_udp_bind(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_1d0;
  sockaddr_in addr;
  uv_udp_t h2;
  uv_udp_t h1;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_udp_init(puVar2,&h1);
    if (iVar1 == 0) {
      iVar1 = uv_udp_init(puVar2,&h2);
      if (iVar1 == 0) {
        iVar1 = uv_udp_bind(&h1,(sockaddr *)&addr,0);
        if (iVar1 == 0) {
          iVar1 = uv_udp_bind(&h2,(sockaddr *)&addr,0);
          if (iVar1 == -0x62) {
            uv_close((uv_handle_t *)&h1,(uv_close_cb)0x0);
            uv_close((uv_handle_t *)&h2,(uv_close_cb)0x0);
            iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
            if (iVar1 == 0) {
              puVar2 = uv_default_loop();
              close_loop(puVar2);
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              if (iVar1 == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar3 = "0 == uv_loop_close(uv_default_loop())";
              uStack_1d0 = 0x3a;
            }
            else {
              pcVar3 = "r == 0";
              uStack_1d0 = 0x38;
            }
          }
          else {
            pcVar3 = "r == UV_EADDRINUSE";
            uStack_1d0 = 0x32;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_1d0 = 0x2f;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_1d0 = 0x2c;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_1d0 = 0x29;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
    uStack_1d0 = 0x24;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-bind.c"
          ,uStack_1d0,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(udp_bind) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  uv_udp_t h1, h2;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  loop = uv_default_loop();

  r = uv_udp_init(loop, &h1);
  ASSERT(r == 0);

  r = uv_udp_init(loop, &h2);
  ASSERT(r == 0);

  r = uv_udp_bind(&h1, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_bind(&h2, (const struct sockaddr*) &addr, 0);
  ASSERT(r == UV_EADDRINUSE);

  uv_close((uv_handle_t*) &h1, NULL);
  uv_close((uv_handle_t*) &h2, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}